

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_> *
__thiscall
testing::internal::
MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>
          (PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_>
           *__return_storage_ptr__,internal *this,ElementsAreArrayMatcher<unsigned_long> *matcher)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_30);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline PredicateFormatterFromMatcher<M> MakePredicateFormatterFromMatcher(
    M matcher) {
  return PredicateFormatterFromMatcher<M>(std::move(matcher));
}